

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall
TPZVec<TPZEqnArray<long_double>_>::TPZVec
          (TPZVec<TPZEqnArray<long_double>_> *this,initializer_list<TPZEqnArray<long_double>_> *list
          )

{
  TPZEqnArray<long_double> *pTVar1;
  undefined8 *puVar2;
  TPZManVector<int,_100> *this_00;
  ulong uVar3;
  size_type sVar4;
  iterator pTVar5;
  undefined1 auVar6 [16];
  long lVar7;
  void *pvVar8;
  TPZEqnArray<long_double> *this_01;
  long lVar9;
  ulong uVar10;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_0198e7e0;
  this->fStore = (TPZEqnArray<long_double> *)0x0;
  uVar3 = list->_M_len;
  if (uVar3 != 0) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar3;
    uVar10 = 0xffffffffffffffff;
    if (SUB168(auVar6 * ZEXT816(0x51e0),8) == 0) {
      uVar10 = SUB168(auVar6 * ZEXT816(0x51e0),0) | 0x10;
    }
    pvVar8 = operator_new__(uVar10);
    *(ulong *)((long)pvVar8 + 8) = uVar3;
    pTVar1 = (TPZEqnArray<long_double> *)((long)pvVar8 + 0x10);
    lVar9 = 0;
    this_01 = pTVar1;
    do {
      TPZEqnArray<long_double>::TPZEqnArray(this_01);
      lVar9 = lVar9 + -0x51e0;
      this_01 = this_01 + 1;
    } while (uVar3 * -0x51e0 - lVar9 != 0);
    this->fStore = pTVar1;
    sVar4 = list->_M_len;
    if (sVar4 != 0) {
      pTVar5 = list->_M_array;
      lVar9 = 0;
      do {
        puVar2 = (undefined8 *)
                 ((long)(pTVar5->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar9 + -0x28);
        this_00 = (TPZManVector<int,_100> *)((long)pvVar8 + lVar9 + 0x18);
        *(undefined8 *)(this_00[-1].fExtAlloc + 0x62) = *puVar2;
        TPZManVector<int,_100>::operator=(this_00,(TPZManVector<int,_100> *)(puVar2 + 1));
        TPZManVector<int,_100>::operator=
                  ((TPZManVector<int,_100> *)
                   ((long)(pTVar1->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc + lVar9 + -0x20
                   ),(TPZManVector<int,_100> *)
                     ((long)(pTVar5->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc +
                     lVar9 + -0x20));
        TPZManVector<long_double,_1000>::operator=
                  ((TPZManVector<long_double,_1000> *)
                   ((long)(pTVar1->fEqValues).super_TPZManVector<long_double,_1000>.fExtAlloc +
                   lVar9 + -0x20),
                   (TPZManVector<long_double,_1000> *)
                   ((long)(pTVar5->fEqValues).super_TPZManVector<long_double,_1000>.fExtAlloc +
                   lVar9 + -0x20));
        TPZManVector<int,_1000>::operator=
                  ((TPZManVector<int,_1000> *)
                   ((long)(pTVar1->fIndex).super_TPZManVector<int,_1000>.fExtAlloc + lVar9 + -0x20),
                   (TPZManVector<int,_1000> *)
                   ((long)(pTVar5->fIndex).super_TPZManVector<int,_1000>.fExtAlloc + lVar9 + -0x20))
        ;
        this_00[0x30].fExtAlloc[0x2a] = *(int *)(puVar2 + 0xa3a);
        lVar7 = lVar9 + -0x28;
        lVar9 = lVar9 + 0x51e0;
      } while ((iterator)((long)pTVar5[1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc + lVar7)
               != pTVar5 + sVar4);
    }
  }
  this->fNElements = uVar3;
  this->fNAlloc = uVar3;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const std::initializer_list<T>& list) : fStore(nullptr) {
    const auto size = list.size();
	if (size > 0)
		fStore = new T[size];

	auto it = list.begin();
	auto it_end = list.end();
	T* aux = fStore;
	for (; it != it_end; it++, aux++)
		*aux = *it;

	fNElements = size;
    fNAlloc = size;
}